

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O3

void bhdct_setup_string_key
               (planck_unit_test_t *tc,ion_dictionary_handler_t *handler,ion_dictionary_t *dict,
               ion_behaviour_fill_level_e fill_level)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  char key [9];
  char local_50 [16];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  bhdct_master_table_init(tc);
  (*bhdct_context.init_fcn)(handler);
  bhdct_dictionary_initialization
            (tc,handler,dict,key_type_null_terminated_string,7,4,bhdct_context.dictionary_size);
  local_50[8] = 0;
  local_50[0] = '\0';
  local_50[1] = '\0';
  local_50[2] = '\0';
  local_50[3] = '\0';
  local_50[4] = '\0';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  switch(fill_level) {
  case ion_fill_edge_cases:
    uVar1 = 0xffffff9a;
    iVar3 = -300;
    do {
      uVar1 = uVar1 + 2;
      sprintf(local_50,"k%d",(ulong)uVar1);
      local_34 = iVar3;
      bhdct_insert(tc,dict,local_50,&local_34,'\x01');
      iVar3 = iVar3 + 6;
    } while (uVar1 < 0xffffffcc);
  case ion_fill_high:
    uVar1 = 0x1ef;
    iVar3 = 5000;
    do {
      uVar1 = uVar1 + 5;
      sprintf(local_50,"k%d",(ulong)uVar1);
      local_38 = iVar3;
      bhdct_insert(tc,dict,local_50,&local_38,'\x01');
      iVar3 = iVar3 + 0x32;
    } while (uVar1 < 0x3e3);
  case ion_fill_medium:
    uVar2 = 0x30;
    iVar3 = 0xfa;
    do {
      uVar1 = (int)uVar2 + 2;
      uVar2 = (ulong)uVar1;
      sprintf(local_50,"k%d",uVar2);
      local_3c = iVar3;
      bhdct_insert(tc,dict,local_50,&local_3c,'\x01');
      iVar3 = iVar3 + 10;
    } while (uVar1 < 0x62);
  case ion_fill_low:
    iVar3 = 0;
    uVar2 = 0;
    do {
      sprintf(local_50,"k%d",uVar2);
      local_40 = iVar3;
      bhdct_insert(tc,dict,local_50,&local_40,'\x01');
      uVar1 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar1;
      iVar3 = iVar3 + 2;
    } while (uVar1 != 10);
    return;
  default:
    return;
  }
}

Assistant:

void
bhdct_setup_string_key(
	planck_unit_test_t			*tc,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dict,
	ion_behaviour_fill_level_e	fill_level
) {
	bhdct_master_table_init(tc);
	bhdct_context.init_fcn(handler);
	/* Note most of these are fixed except the dictionary size */
	bhdct_dictionary_initialization(tc, handler, dict, key_type_null_terminated_string, 7, sizeof(int), bhdct_context.dictionary_size);

	char key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	/* This switch statement intentionally doesn't have breaks - we want it to fall through. */
	int i;

	switch (fill_level) {
		case ion_fill_edge_cases: {
			ION_FILL_EDGE_LOOP(i) {
				sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
				bhdct_insert(tc, dict, key, ION_EDGE_VALUE(i), boolean_true);
			}
		}

		case ion_fill_high: {
			ION_FILL_HIGH_LOOP(i) {
				sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
				bhdct_insert(tc, dict, key, ION_HIGH_VALUE(i), boolean_true);
			}
		}

		case ion_fill_medium: {
			ION_FILL_MEDIUM_LOOP(i) {
				sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
				bhdct_insert(tc, dict, key, ION_MEDIUM_VALUE(i), boolean_true);
			}
		}

		case ion_fill_low: {
			ION_FILL_LOW_LOOP(i) {
				sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, i);
				bhdct_insert(tc, dict, key, ION_LOW_VALUE(i), boolean_true);
			}
		}

		case ion_fill_none: {
			/* Intentionally left blank */
		}
	}
}